

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_test.cpp
# Opt level: O3

bool crn::progress_callback(uint percentage_complete,void *pUser_data_ptr)

{
  if (progress_callback::s_prev_percentage_complete != percentage_complete) {
    crnlib::console::progress("%u%%",(ulong)percentage_complete);
    progress_callback::s_prev_percentage_complete = percentage_complete;
  }
  return true;
}

Assistant:

static bool progress_callback(uint percentage_complete, void* pUser_data_ptr)
    {
        static int s_prev_percentage_complete = -1;
        pUser_data_ptr;
        if (s_prev_percentage_complete != static_cast<int>(percentage_complete))
        {
            console::progress("%u%%", percentage_complete);
            s_prev_percentage_complete = percentage_complete;
        }
        return true;
    }